

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.cpp
# Opt level: O2

bool ArgumentsParse(int argc,char **argv,Arguments *args)

{
  int iVar1;
  uint32_t uVar2;
  char *__format;
  getopt_context_t ctx;
  getopt_context_t gStack_58;
  
  iVar1 = getopt_create_context(&gStack_58,argc,argv,option_list);
  if (iVar1 < 0) {
    printf("error while creating getopt ctx, bad options-list?");
    return false;
  }
  do {
    iVar1 = getopt_next(&gStack_58);
    switch(iVar1) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::assign((char *)args);
      break;
    case 2:
      std::__cxx11::string::assign((char *)&args->Output);
      break;
    case 3:
      uVar2 = atoi(gStack_58.current_opt_arg);
      args->Width = uVar2;
      break;
    case 4:
      uVar2 = atoi(gStack_58.current_opt_arg);
      args->Height = uVar2;
      break;
    case 5:
      iVar1 = atoi(gStack_58.current_opt_arg);
      args->EnableIni = iVar1 != 0;
      break;
    case -1:
      if ((args->Input)._M_string_length != 0) {
        return true;
      }
      puts("live-glsl: no input file (--input [path])");
      return false;
    default:
      if (iVar1 == 0x21) {
        __format = "live-glsl: invalid use of flag %s\n";
        goto LAB_0012cdcb;
      }
      if (iVar1 == 0x3f) {
        __format = "live-glsl: unknown flag %s\n";
        goto LAB_0012cdcb;
      }
      if (iVar1 == 0x2b) {
        __format = "live-glsl: got argument without flag: %s\n";
LAB_0012cdcb:
        printf(__format,gStack_58.current_opt_arg);
        return false;
      }
    }
  } while( true );
}

Assistant:

bool ArgumentsParse(int argc, const char** argv, Arguments& args) {
    getopt_context_t ctx;
    if (getopt_create_context(&ctx, argc, argv, option_list) < 0) {
        printf( "error while creating getopt ctx, bad options-list?" );
        return false;
    }

    int opt = 0;
    while ((opt = getopt_next(&ctx)) != -1) {
        switch (opt) {
            case '+':
                printf("live-glsl: got argument without flag: %s\n", ctx.current_opt_arg);
                return false;
            case '?':
                printf("live-glsl: unknown flag %s\n", ctx.current_opt_arg);
                return false;
            case '!':
                printf("live-glsl: invalid use of flag %s\n", ctx.current_opt_arg);
                return false;
            case OPTION_INPUT:
                args.Input = ctx.current_opt_arg;
                break;
            case OPTION_OUTPUT:
                args.Output = ctx.current_opt_arg;
                break;
            case OPTION_WIDTH:
                args.Width = atoi(ctx.current_opt_arg);
                break;
            case OPTION_HEIGHT:
                args.Height = atoi(ctx.current_opt_arg);
                break;
            case OPTION_INI:
                args.EnableIni = (bool)atoi(ctx.current_opt_arg);
                break;
            default:
                break;
        }
    }
    if (args.Input.empty()) {
        printf("live-glsl: no input file (--input [path])\n");
        return false;
    }
    return true;
}